

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int runAI(void)

{
  bool bVar1;
  uint local_c;
  
  boyi_max_x = -1;
  boyi_max_y = -1;
  boyi_search((char)chess_num[0],(char)chess_num[1],chessboard,(char)AI_COLOR,'\x01',-2000000,
              2000000);
  bVar1 = boyi_max_x != -1;
  if (bVar1) {
    printf("%c%c\n",(ulong)(boyi_max_x + 0x31),(ulong)(boyi_max_y + 0x61));
    putchess(boyi_max_x,boyi_max_y,AI_COLOR);
    refresh();
  }
  local_c = (uint)bVar1;
  return local_c;
}

Assistant:

int runAI() {
    boyi_max_x = -1;
    boyi_max_y = -1;
    boyi_search(chess_num[0], chess_num[1], chessboard, AI_COLOR, 1, -2000000, 2000000);
/*#ifdef AI_COLOR_BLACK
	boyi_search(chess_num[0], chess_num[1], chessboard, BLACK, 1, -2000000, 2000000);
#endif
#ifdef AI_COLOR_WHITE
	boyi_search(chess_num[0], chess_num[1], chessboard, WHITE, 1, -2000000, 2000000);
#endif*/
    if (boyi_max_x == -1) {
        return 0;//AI can't move
    }
    printf("%c%c\n", boyi_max_x + '1', boyi_max_y + 'a');
    putchess(boyi_max_x, boyi_max_y, AI_COLOR);
/*#ifdef AI_COLOR_BLACK
	putchess(boyi_max_x, boyi_max_y, BLACK);
#endif
#ifdef AI_COLOR_WHITE
	putchess(boyi_max_x, boyi_max_y, WHITE);
#endif*/
    refresh();
    return 1;
}